

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_connection.cpp
# Opt level: O0

void __thiscall myutils::IpcConnection::clear_data(IpcConnection *this)

{
  thread *this_00;
  FileMapping *pFVar1;
  SharedSemaphore *pSVar2;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  IpcConnection *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->m_send_mtx);
  if (this->m_recv_thread != (thread *)0x0) {
    this->m_should_exit = true;
    std::thread::join();
    this_00 = this->m_recv_thread;
    if (this_00 != (thread *)0x0) {
      std::thread::~thread(this_00);
      operator_delete(this_00);
    }
    this->m_recv_thread = (thread *)0x0;
  }
  if (this->m_my_shmem != (FileMapping *)0x0) {
    pFVar1 = this->m_my_shmem;
    if (pFVar1 != (FileMapping *)0x0) {
      FileMapping::~FileMapping(pFVar1);
      operator_delete(pFVar1);
    }
    this->m_my_shmem = (FileMapping *)0x0;
  }
  if (this->m_svr_shmem != (FileMapping *)0x0) {
    pFVar1 = this->m_svr_shmem;
    if (pFVar1 != (FileMapping *)0x0) {
      FileMapping::~FileMapping(pFVar1);
      operator_delete(pFVar1);
    }
    this->m_svr_shmem = (FileMapping *)0x0;
  }
  this->m_send_queue = (ShmemQueue *)0x0;
  this->m_recv_queue = (ShmemQueue *)0x0;
  this->m_slot_info = (ConnectionSlotInfo *)0x0;
  this->m_slot = (ConnectionSlot *)0x0;
  if (this->m_sem_recv != (SharedSemaphore *)0x0) {
    pSVar2 = this->m_sem_recv;
    if (pSVar2 != (SharedSemaphore *)0x0) {
      SharedSemaphore::~SharedSemaphore(pSVar2);
      operator_delete(pSVar2);
    }
    this->m_sem_recv = (SharedSemaphore *)0x0;
  }
  if (this->m_sem_send != (SharedSemaphore *)0x0) {
    pSVar2 = this->m_sem_send;
    if (pSVar2 != (SharedSemaphore *)0x0) {
      SharedSemaphore::~SharedSemaphore(pSVar2);
      operator_delete(pSVar2);
    }
    this->m_sem_send = (SharedSemaphore *)0x0;
  }
  if (this->m_socket != -1) {
    ::close(this->m_socket);
    this->m_socket = -1;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void IpcConnection::clear_data()
{
    unique_lock<mutex> lock(m_send_mtx);

    if (m_recv_thread) {
        m_should_exit = true;
        m_recv_thread->join();
        delete m_recv_thread;
        m_recv_thread = nullptr;
    }

    if (m_my_shmem) {
        delete m_my_shmem;
        m_my_shmem = nullptr;
    }

    if (m_svr_shmem) {
        delete m_svr_shmem;
        m_svr_shmem = nullptr;
    }

    m_send_queue = nullptr;
    m_recv_queue = nullptr;
    m_slot_info = nullptr;
    m_slot = nullptr;

    if (m_sem_recv) {
        delete m_sem_recv;
        m_sem_recv = nullptr;
    }

    if (m_sem_send) {
        delete m_sem_send;
        m_sem_send = nullptr;
    }

    if (m_socket != INVALID_SOCKET) {
        closesocket(m_socket);
        m_socket = INVALID_SOCKET;
    }
}